

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval * tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc1 *func,Interval *arg0)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  double *pdVar5;
  undefined8 *puVar6;
  bool bVar7;
  deBool dVar8;
  float fVar9;
  Interval local_200;
  Interval local_1e8;
  Interval local_1d0;
  Interval *local_1b8;
  Interval *pIStack_1b0;
  Interval *local_1a8;
  Interval **local_1a0;
  Interval *point_3;
  double dStack_190;
  double local_188;
  double *local_180;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_138;
  ScopedRoundingMode point_ctx__1;
  Interval *val_1;
  double x_1;
  double local_120;
  double local_118;
  Interval *local_110;
  Interval *pIStack_108;
  Interval *local_100;
  Interval **local_f8;
  Interval *point_1;
  double dStack_e8;
  double local_e0;
  undefined8 *local_d8;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_a8 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_80;
  ScopedRoundingMode point_ctx_;
  Interval *val;
  double x;
  double local_68;
  double local_60;
  undefined1 local_58 [8];
  Interval val_hi_;
  Interval val_lo_;
  Interval *val_dst_;
  Interval *val_arg_;
  Interval *arg0_local;
  DoubleFunc1 *func_local;
  
  Interval::Interval(__return_storage_ptr__);
  do {
    Interval::Interval((Interval *)&val_hi_.m_hi);
    Interval::Interval((Interval *)local_58);
    bVar7 = Interval::empty(arg0);
    if (bVar7) {
      Interval::Interval((Interval *)&x);
      *(double *)__return_storage_ptr__ = x;
      __return_storage_ptr__->m_lo = local_68;
      __return_storage_ptr__->m_hi = local_60;
    }
    else {
      dVar1 = Interval::lo(arg0);
      pdStack_80 = &val_hi_.m_hi;
      do {
        ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
        point_lo_.m_hi = (double)pdStack_80;
        Interval::Interval((Interval *)auStack_a8);
        Interval::Interval((Interval *)&point);
        local_d8 = (undefined8 *)auStack_a8;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar2 = (*func)(dVar1);
        Interval::Interval((Interval *)&point_1,dVar2);
        puVar6 = local_d8;
        local_d8[2] = local_e0;
        dVar2 = dStack_e8;
        *puVar6 = point_1;
        puVar6[1] = dVar2;
        local_f8 = &point;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        dVar2 = (*func)(dVar1);
        Interval::Interval((Interval *)&local_110,dVar2);
        ppIVar4 = local_f8;
        local_f8[2] = local_100;
        pIVar3 = pIStack_108;
        *ppIVar4 = local_110;
        ppIVar4[1] = pIVar3;
        Interval::operator|((Interval *)&x_1,(Interval *)auStack_a8,(Interval *)&point);
        *(double *)point_lo_.m_hi = x_1;
        *(double *)((long)point_lo_.m_hi + 8) = local_120;
        *(double *)((long)point_lo_.m_hi + 0x10) = local_118;
        ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      dVar1 = Interval::hi(arg0);
      puStack_138 = (undefined8 *)local_58;
      do {
        ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4));
        puVar6 = puStack_138;
        Interval::Interval((Interval *)&point_hi__1.m_hi);
        Interval::Interval((Interval *)&point_2);
        local_180 = &point_hi__1.m_hi;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
        dVar2 = (*func)(dVar1);
        Interval::Interval((Interval *)&point_3,dVar2);
        pdVar5 = local_180;
        local_180[2] = local_188;
        dVar2 = dStack_190;
        *pdVar5 = (double)point_3;
        pdVar5[1] = dVar2;
        local_1a0 = &point_2;
        deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
        dVar2 = (*func)(dVar1);
        Interval::Interval((Interval *)&local_1b8,dVar2);
        ppIVar4 = local_1a0;
        local_1a0[2] = local_1a8;
        pIVar3 = pIStack_1b0;
        *ppIVar4 = local_1b8;
        ppIVar4[1] = pIVar3;
        Interval::operator|(&local_1d0,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
        *puVar6 = local_1d0._0_8_;
        puVar6[1] = local_1d0.m_lo;
        puVar6[2] = local_1d0.m_hi;
        ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst__1 + 4));
        dVar8 = ::deGetFalse();
      } while (dVar8 != 0);
      Interval::operator|(&local_1e8,(Interval *)&val_hi_.m_hi,(Interval *)local_58);
      __return_storage_ptr__->m_hasNaN = local_1e8.m_hasNaN;
      *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_1e8._1_7_;
      __return_storage_ptr__->m_lo = local_1e8.m_lo;
      __return_storage_ptr__->m_hi = local_1e8.m_hi;
    }
    bVar7 = Interval::hasNaN(arg0);
    if (bVar7) {
      fVar9 = std::numeric_limits<float>::quiet_NaN();
      Interval::Interval(&local_200,(double)fVar9);
      Interval::operator|=(__return_storage_ptr__,&local_200);
    }
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc1& func, const Interval& arg0)
{
	Interval ret;
	TCU_INTERVAL_APPLY_MONOTONE1(ret, x, arg0, val,
								 TCU_SET_INTERVAL(val, point, point = func(x)));
	return ret;
}